

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPFromClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPFromClause *this)

{
  ulong uVar1;
  string local_98;
  string local_78;
  OpenMPFromClauseKind local_58;
  allocator<char> local_51;
  OpenMPFromClauseKind from_kind;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPFromClause *local_18;
  OpenMPFromClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPFromClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"from ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&from_kind,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getKind(this);
  if (local_58 == OMPC_FROM_mapper) {
    std::__cxx11::string::operator+=((string *)&from_kind,"mapper");
    std::__cxx11::string::operator+=((string *)&from_kind,"(");
    getMapperIdentifier_abi_cxx11_(&local_78,this);
    std::__cxx11::string::operator+=((string *)&from_kind,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::operator+=((string *)&from_kind,")");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&from_kind," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_98,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&from_kind,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::operator+=((string *)&from_kind,") ");
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&from_kind);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&from_kind);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPFromClause::toString() {

    std::string result = "from ";
    std::string clause_string = "(";
    OpenMPFromClauseKind from_kind = this->getKind();
    switch (from_kind) {
        case OMPC_FROM_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
   if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}